

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb-test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  ulong uVar2;
  long in_RSI;
  int in_EDI;
  cubeb_client cl;
  bool res;
  uint32_t latency_override;
  operation_data op;
  uint32_t in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  cubeb_log_level in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  cubeb_device_type in_stack_ffffffffffffff64;
  cubeb_log_level in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  cubeb_client local_88;
  undefined1 local_21;
  int local_20;
  int local_1c;
  cubeb_log_level cVar3;
  undefined4 uVar4;
  int local_4;
  
  local_1c = 1;
  if (1 < in_EDI) {
    if (**(char **)(in_RSI + 8) == 'r') {
      local_1c = 0;
    }
    else if (**(char **)(in_RSI + 8) == 'p') {
      local_1c = 1;
    }
    else if (**(char **)(in_RSI + 8) == 'd') {
      local_1c = 2;
    }
    else if (**(char **)(in_RSI + 8) == 'l') {
      local_1c = 3;
    }
    else if (**(char **)(in_RSI + 8) == 'c') {
      local_1c = 4;
    }
  }
  cVar3 = 0xac44;
  local_20 = 0;
  if ((local_1c == 3) && (2 < in_EDI)) {
    uVar2 = strtoul(*(char **)(in_RSI + 0x10),(char **)0x0,10);
    local_20 = (int)uVar2;
    printf("LATENCY_TESTING %d\n",uVar2 & 0xffffffff);
  }
  else if (2 < in_EDI) {
    uVar2 = strtoul(*(char **)(in_RSI + 0x10),(char **)0x0,0);
    cVar3 = (cubeb_log_level)uVar2;
  }
  local_21 = 0;
  cubeb_client::cubeb_client
            ((cubeb_client *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  cubeb_client::activate_log
            ((cubeb_client *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
             in_stack_ffffffffffffff54);
  fprintf(_stderr,"Log level is DISABLED\n");
  cubeb_client::init(&local_88,(EVP_PKEY_CTX *)0x0);
  uVar4 = 0;
  fprintf(_stderr,"collection device type is UNKNOWN\n");
  if (local_1c == 4) {
    fprintf(_stderr,"collection device type changed to OUTPUT\n");
    local_21 = cubeb_client::register_device_collection_changed
                         ((cubeb_client *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          in_stack_ffffffffffffff64);
    if ((bool)local_21) {
      fprintf(_stderr,"register_device_collection_changed succeed\n");
    }
    else {
      fprintf(_stderr,"register_device_collection_changed failed\n");
    }
  }
  else {
    if (((local_1c == 1) || (local_1c == 2)) || (local_1c == 3)) {
      in_stack_ffffffffffffff64 = CUBEB_DEVICE_TYPE_OUTPUT;
      in_stack_ffffffffffffff6c = 2;
      local_88.output_params.rate = cVar3;
      local_88.output_params.format = CUBEB_SAMPLE_FLOAT32LE;
      local_88.output_params.channels = 2;
      local_88.output_params.layout = 3;
      local_88.output_params.prefs = CUBEB_STREAM_PREF_NONE;
      in_stack_ffffffffffffff68 = cVar3;
    }
    if (((local_1c == 0) || (local_1c == 2)) || (local_1c == 3)) {
      in_stack_ffffffffffffff50 = 2;
      in_stack_ffffffffffffff58 = 1;
      in_stack_ffffffffffffff5c = 0;
      in_stack_ffffffffffffff60 = 0;
      local_88.input_params.rate = cVar3;
      local_88.input_params.format = CUBEB_SAMPLE_FLOAT32LE;
      local_88.input_params.channels = 1;
      local_88.input_params.layout = 0;
      local_88.input_params.prefs = CUBEB_STREAM_PREF_NONE;
      in_stack_ffffffffffffff54 = cVar3;
    }
    if ((local_1c == 3) &&
       (cubeb_client::set_latency_testing
                  ((cubeb_client *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   SUB41(in_stack_ffffffffffffff4c >> 0x18,0)), local_20 != 0)) {
      cubeb_client::set_latency_frames
                ((cubeb_client *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                 in_stack_ffffffffffffff4c);
    }
    local_21 = cubeb_client::init_stream((cubeb_client *)CONCAT44(uVar4,cVar3));
    if (!(bool)local_21) {
      fprintf(_stderr,"stream_init failed\n");
      local_4 = -1;
      goto LAB_00106003;
    }
    fprintf(_stderr,"stream_init succeed\n");
    local_21 = cubeb_client::start_stream
                         ((cubeb_client *)
                          CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    if ((bool)local_21) {
      fprintf(_stderr,"stream_start succeed\n");
    }
    else {
      fprintf(_stderr,"stream_init failed\n");
    }
  }
  do {
    fprintf(_stderr,"press `q` to abort or `h` for help\n");
    getchar();
    bVar1 = choose_action((cubeb_client *)
                          CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                          (operation_data *)
                          CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                          in_stack_ffffffffffffff5c);
  } while (bVar1);
  cubeb_client::destroy((cubeb_client *)0x105ff0);
  local_4 = 0;
LAB_00106003:
  cubeb_client::~cubeb_client(&local_88);
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
#ifdef _WIN32
  CoInitialize(nullptr);
#endif

  operation_data op;
  op.pm = PLAYBACK;
  if (argc > 1) {
    if ('r' == argv[1][0]) {
      op.pm = RECORD;
    } else if ('p' == argv[1][0]) {
      op.pm = PLAYBACK;
    } else if ('d' == argv[1][0]) {
      op.pm = DUPLEX;
    } else if ('l' == argv[1][0]) {
      op.pm = LATENCY_TESTING;
    } else if ('c' == argv[1][0]) {
      op.pm = COLLECTION_CHANGE;
    }
  }
  op.rate = DEFAULT_RATE;
  uint32_t latency_override = 0;
  if (op.pm == LATENCY_TESTING && argc > 2) {
    latency_override = strtoul(argv[2], NULL, 10);
    printf("LATENCY_TESTING %d\n", latency_override);
  } else if (argc > 2) {
    op.rate = strtoul(argv[2], NULL, 0);
  }

  bool res = false;
  cubeb_client cl;
  cl.activate_log(CUBEB_LOG_DISABLED);
  fprintf(stderr, "Log level is DISABLED\n");
  cl.init(/* default backend */);

  op.collection_device_type = CUBEB_DEVICE_TYPE_UNKNOWN;
  fprintf(stderr, "collection device type is UNKNOWN\n");
  if (op.pm == COLLECTION_CHANGE) {
    op.collection_device_type = CUBEB_DEVICE_TYPE_OUTPUT;
    fprintf(stderr, "collection device type changed to OUTPUT\n");
    res = cl.register_device_collection_changed(op.collection_device_type);
    if (res) {
      fprintf(stderr, "register_device_collection_changed succeed\n");
    } else {
      fprintf(stderr, "register_device_collection_changed failed\n");
    }
  } else {
    if (op.pm == PLAYBACK || op.pm == DUPLEX || op.pm == LATENCY_TESTING) {
      cl.output_params = {CUBEB_SAMPLE_FLOAT32NE, op.rate, DEFAULT_OUTPUT_CHANNELS,
                          CUBEB_LAYOUT_STEREO, CUBEB_STREAM_PREF_NONE};
    }
    if (op.pm == RECORD || op.pm == DUPLEX || op.pm == LATENCY_TESTING) {
      cl.input_params = {CUBEB_SAMPLE_FLOAT32NE, op.rate, DEFAULT_INPUT_CHANNELS, CUBEB_LAYOUT_UNDEFINED, CUBEB_STREAM_PREF_NONE};
    }
    if (op.pm == LATENCY_TESTING) {
      cl.set_latency_testing(true);
      if (latency_override) {
        cl.set_latency_frames(latency_override);
      }
    }
    res = cl.init_stream();
    if (!res) {
      fprintf(stderr, "stream_init failed\n");
      return -1;
    }
    fprintf(stderr, "stream_init succeed\n");

    res = cl.start_stream();
    if (res) {
      fprintf(stderr, "stream_start succeed\n");
    } else {
      fprintf(stderr, "stream_init failed\n");
    }
  }

  // User input
  do {
    fprintf(stderr, "press `q` to abort or `h` for help\n");
  } while (choose_action(cl, &op, getchar()));

  cl.destroy();

  return 0;
}